

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O2

RunResult __thiscall
wabt::interp::Thread::
DoSimdLoadExtend<wabt::interp::Simd<short,(unsigned_char)8>,wabt::interp::Simd<signed_char,(unsigned_char)8>>
          (Thread *this,Instr instr,Ptr *out_trap)

{
  u8 i;
  RunResult RVar1;
  long lVar2;
  Simd<signed_char,_(unsigned_char)__b_> val;
  Simd<short,_(unsigned_char)__b_> result;
  
  RVar1 = Load<wabt::interp::Simd<signed_char,(unsigned_char)8>>(this,instr,&val,out_trap);
  if (RVar1 == Ok) {
    for (lVar2 = 0; lVar2 != 8; lVar2 = lVar2 + 1) {
      result.v[lVar2] = (short)val.v[lVar2];
    }
    Push<wabt::interp::Simd<short,(unsigned_char)8>>(this,result);
    RVar1 = Ok;
  }
  else {
    RVar1 = Trap;
  }
  return RVar1;
}

Assistant:

RunResult Thread::DoSimdLoadExtend(Instr instr, Trap::Ptr* out_trap) {
  T val;
  if (Load<T>(instr, &val, out_trap) != RunResult::Ok) {
    return RunResult::Trap;
  }
  S result;
  for (u8 i = 0; i < S::lanes; ++i) {
    result[i] = val[i];
  }
  Push(result);
  return RunResult::Ok;
}